

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void TestRawLogging(void)

{
  string *psVar1;
  undefined8 uVar2;
  int32 verbose_level___8;
  int32 verbose_level___7;
  int32 verbose_level___6;
  int32 verbose_level___5;
  int32 verbose_level___4;
  int32 verbose_level___3;
  int32 verbose_level___2;
  int32 verbose_level___1;
  int32 verbose_level__;
  int j;
  void *p;
  char const_s [12];
  char s [6];
  NewHook new_hook;
  FlagSaver saver;
  string huge_str;
  string *foo;
  allocator<char> *in_stack_fffffffffffffee8;
  char in_stack_fffffffffffffef7;
  size_type in_stack_fffffffffffffef8;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  bool local_f7;
  bool local_f6;
  bool local_f4;
  bool local_f3;
  bool local_f1;
  undefined1 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff19;
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  undefined1 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1d;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  int32 in_stack_ffffffffffffff4c;
  int32 verbose_level;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar9;
  undefined8 local_63;
  undefined4 local_5b;
  undefined4 local_57;
  undefined2 local_53;
  NewHook local_51;
  FlagSaver local_50;
  allocator<char> local_41;
  string local_40 [35];
  undefined1 local_1d;
  allocator<char> local_9;
  string *local_8;
  
  psVar1 = (string *)operator_new(0x126581);
  local_1d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,
             (char *)CONCAT17(in_stack_ffffffffffffff1f,
                              CONCAT16(in_stack_ffffffffffffff1e,
                                       CONCAT15(in_stack_ffffffffffffff1d,
                                                CONCAT14(in_stack_ffffffffffffff1c,
                                                         CONCAT13(in_stack_ffffffffffffff1b,
                                                                  CONCAT12(in_stack_ffffffffffffff1a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff19,
                                                  in_stack_ffffffffffffff18))))))),
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT15(in_stack_ffffffffffffff15,
                                        CONCAT14(in_stack_ffffffffffffff14,
                                                 CONCAT13(in_stack_ffffffffffffff13,
                                                          CONCAT12(in_stack_ffffffffffffff12,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff11,
                                                  in_stack_ffffffffffffff10))))))));
  local_1d = 0;
  std::allocator<char>::~allocator(&local_9);
  local_8 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))),
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef7,in_stack_fffffffffffffee8);
  std::allocator<char>::~allocator(&local_41);
  google::FlagSaver::FlagSaver(&local_50);
  NewHook::NewHook(&local_51);
  uVar2 = std::__cxx11::string::c_str();
  google::RawLog__(0x400b333333333333,(char *)0x0,0x162203,(char *)0x141,"%s%s%d%c%f",uVar2,"bar ",
                   10,0x20);
  local_57 = 0x61727261;
  local_53 = 0x79;
  google::RawLog__(1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x143,"%s",&local_57);
  local_63 = 0x72612074736e6f63;
  local_5b = 0x796172;
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x145,"%s",&local_63);
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x147,"ptr %p",0x12345678);
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x149,"ptr %p",0);
  uVar2 = std::__cxx11::string::c_str();
  google::RawLog__(2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x14b,"%s%d%c%010d%s%1x",uVar2,1000,0x20,1000," ",1000);
  bVar3 = false;
  if ((-1 < *TestRawLogging::vlocal__) &&
     (bVar3 = true, TestRawLogging::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
  }
  if (bVar3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x14c,"foo %d",1000);
  }
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x14f,"foo %d",1000);
  uVar2 = std::__cxx11::string::c_str();
  google::RawLog__(1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x155,"Huge string: %s",uVar2);
  bVar3 = false;
  if ((-1 < *TestRawLogging()::vlocal__) &&
     (bVar3 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
  }
  if (bVar3 != false) {
    uVar2 = std::__cxx11::string::c_str();
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x156,"Huge string: %s",uVar2);
  }
  fLI::FLAGS_v = 0;
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x159,"log");
  bVar3 = false;
  if ((-1 < *TestRawLogging()::vlocal__) &&
     (bVar3 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
  }
  if (bVar3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x15a,"vlog 0 on");
  }
  bVar3 = false;
  if ((0 < *TestRawLogging()::vlocal__) &&
     (bVar3 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
  }
  if (bVar3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x15b,"vlog 1 off");
  }
  bVar3 = false;
  if ((1 < *TestRawLogging()::vlocal__) &&
     (bVar3 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
  }
  uVar9 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff64);
  if (bVar3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x15c,"vlog 2 off");
  }
  uVar8 = 3;
  local_f1 = false;
  if ((2 < *TestRawLogging()::vlocal__) &&
     (local_f1 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    local_f1 = google::InitVLOG3__((int32 **)CONCAT44(uVar9,3),
                                   (int32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58),
                                   (char *)CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50),
                                   in_stack_ffffffffffffff4c);
  }
  uVar7 = CONCAT13(local_f1,(int3)in_stack_ffffffffffffff5c);
  if (local_f1 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x15d,"vlog 3 off");
  }
  fLI::FLAGS_v = 2;
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                   ,0x15f,"log");
  uVar6 = 1;
  local_f3 = false;
  if (0 < *TestRawLogging()::vlocal__) {
    local_f4 = true;
    if (TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized) {
      local_f4 = google::InitVLOG3__((int32 **)CONCAT44(uVar9,uVar8),(int32 *)CONCAT44(uVar7,1),
                                     (char *)CONCAT44(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50),
                                     in_stack_ffffffffffffff4c);
    }
    local_f3 = local_f4;
  }
  uVar5 = CONCAT13(local_f3,(int3)in_stack_ffffffffffffff54);
  if (local_f3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x160,"vlog 1 on");
  }
  uVar4 = 2;
  local_f6 = false;
  if (1 < *TestRawLogging()::vlocal__) {
    local_f7 = true;
    if (TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized) {
      local_f7 = google::InitVLOG3__((int32 **)CONCAT44(uVar9,uVar8),(int32 *)CONCAT44(uVar7,uVar6),
                                     (char *)CONCAT44(uVar5,2),in_stack_ffffffffffffff4c);
    }
    local_f6 = local_f7;
  }
  verbose_level = CONCAT13(local_f6,(int3)in_stack_ffffffffffffff4c);
  if (local_f6 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x161,"vlog 2 on");
  }
  bVar3 = false;
  if ((2 < *TestRawLogging()::vlocal__) &&
     (bVar3 = true, TestRawLogging()::vlocal__ == &google::kLogSiteUninitialized)) {
    bVar3 = google::InitVLOG3__((int32 **)CONCAT44(uVar9,uVar8),(int32 *)CONCAT44(uVar7,uVar6),
                                (char *)CONCAT44(uVar5,uVar4),verbose_level);
  }
  if (bVar3 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging_unittest.cc"
                     ,0x162,"vlog 3 off");
  }
  if (local_8 != (string *)0x0) {
    psVar1 = local_8;
    std::__cxx11::string::~string(local_8);
    operator_delete(psVar1,0x20);
  }
  NewHook::~NewHook(&local_51);
  google::FlagSaver::~FlagSaver(&local_50);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void TestRawLogging() {
  string* foo = new string("foo ");
  string huge_str(50000, 'a');

  FlagSaver saver;

  // Check that RAW loggging does not use mallocs.
  NewHook new_hook;

  RAW_LOG(INFO, "%s%s%d%c%f", foo->c_str(), "bar ", 10, ' ', 3.4);
  char s[] = "array";
  RAW_LOG(WARNING, "%s", s);
  const char const_s[] = "const array";
  RAW_LOG(INFO, "%s", const_s);
  void* p = reinterpret_cast<void*>(PTR_TEST_VALUE);
  RAW_LOG(INFO, "ptr %p", p);
  p = NULL;
  RAW_LOG(INFO, "ptr %p", p);
  int j = 1000;
  RAW_LOG(ERROR, "%s%d%c%010d%s%1x", foo->c_str(), j, ' ', j, " ", j);
  RAW_VLOG(0, "foo %d", j);

#ifdef NDEBUG
  RAW_LOG(INFO, "foo %d", j);  // so that have same stderr to compare
#else
  RAW_DLOG(INFO, "foo %d", j);  // test RAW_DLOG in debug mode
#endif

  // test how long messages are chopped:
  RAW_LOG(WARNING, "Huge string: %s", huge_str.c_str());
  RAW_VLOG(0, "Huge string: %s", huge_str.c_str());

  FLAGS_v = 0;
  RAW_LOG(INFO, "log");
  RAW_VLOG(0, "vlog 0 on");
  RAW_VLOG(1, "vlog 1 off");
  RAW_VLOG(2, "vlog 2 off");
  RAW_VLOG(3, "vlog 3 off");
  FLAGS_v = 2;
  RAW_LOG(INFO, "log");
  RAW_VLOG(1, "vlog 1 on");
  RAW_VLOG(2, "vlog 2 on");
  RAW_VLOG(3, "vlog 3 off");

#ifdef NDEBUG
  RAW_DCHECK(1 == 2, " RAW_DCHECK's shouldn't be compiled in normal mode");
#endif

  RAW_CHECK(1 == 1, "should be ok");
  RAW_DCHECK(true, "should be ok");

  delete foo;
}